

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::ComparisonTest_UnknownFieldsAll_Test::TestBody
          (ComparisonTest_UnknownFieldsAll_Test *this)

{
  SooRep *this_00;
  int iVar1;
  UnknownFieldSet *pUVar2;
  UnknownField *pUVar3;
  string *psVar4;
  char *message;
  AssertHelper AStack_48;
  internal local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  string local_30;
  
  UnknownFieldSet::AddVarint((this->super_ComparisonTest).unknown1_,0xf3,0x7a);
  UnknownFieldSet::AddFixed64((this->super_ComparisonTest).unknown1_,0xf4,0x172356);
  UnknownFieldSet::AddFixed64((this->super_ComparisonTest).unknown1_,0xf4,0x98);
  pUVar2 = UnknownFieldSet::AddGroup((this->super_ComparisonTest).unknown1_,0xf5);
  UnknownFieldSet::AddFixed32(pUVar2,0xf8,1);
  this_00 = (SooRep *)(this->super_ComparisonTest).unknown1_;
  iVar1 = protobuf::internal::SooRep::size
                    (this_00,(undefined1  [16])
                             ((undefined1  [16])this_00->field_0 & (undefined1  [16])0x4) ==
                             (undefined1  [16])0x0);
  if (iVar1 < 4) {
    protobuf::_GLOBAL__N_1::ComparisonTest_UnknownFieldsAll_Test::TestBody();
  }
  else {
    pUVar3 = RepeatedField<google::protobuf::UnknownField>::elements
                       ((RepeatedField<google::protobuf::UnknownField> *)this_00,
                        (undefined1  [16])
                        ((undefined1  [16])this_00->field_0 & (undefined1  [16])0x4) ==
                        (undefined1  [16])0x0);
    if (pUVar3[3].type_ == 4) {
      UnknownFieldSet::AddFixed32(pUVar3[3].data_.group,0xf8,2);
      pUVar2 = UnknownFieldSet::AddGroup((this->super_ComparisonTest).unknown1_,0xf9);
      UnknownFieldSet::AddFixed64(pUVar2,0xfa,1);
      UnknownFieldSet::AddVarint((this->super_ComparisonTest).unknown2_,0xf3,0x79);
      psVar4 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_
                         ((this->super_ComparisonTest).unknown2_,0x1209a);
      std::__cxx11::string::_M_replace((ulong)psVar4,0,(char *)psVar4->_M_string_length,0x1229882);
      pUVar2 = UnknownFieldSet::AddGroup((this->super_ComparisonTest).unknown2_,0xf5);
      UnknownFieldSet::AddFixed32(pUVar2,0xf8,3);
      UnknownFieldSet::AddGroup((this->super_ComparisonTest).unknown2_,0xf7);
      protobuf::(anonymous_namespace)::ComparisonTest::Run_abi_cxx11_
                (&local_30,this,(Message *)&(this->super_ComparisonTest).empty1_,
                 (Message *)&(this->super_ComparisonTest).empty2_);
      testing::internal::CmpHelperEQ<char[263],std::__cxx11::string>
                (local_40,
                 "\"modified: 243[0]: 122 -> 121\\n\" \"deleted: 244[0]: 0x0000000000172356\\n\" \"deleted: 244[1]: 0x0000000000000098\\n\" \"modified: 245[0].248[0]: 0x00000001 -> 0x00000003\\n\" \"deleted: 245[0].248[1]: 0x00000002\\n\" \"added: 247[0]: { ... }\\n\" \"deleted: 249[0]: { ... }\\n\" \"added: 73882[0]: \\\"test 123\\\"\\n\""
                 ,"RunUn()",
                 (char (*) [263])
                 "modified: 243[0]: 122 -> 121\ndeleted: 244[0]: 0x0000000000172356\ndeleted: 244[1]: 0x0000000000000098\nmodified: 245[0].248[0]: 0x00000001 -> 0x00000003\ndeleted: 245[0].248[1]: 0x00000002\nadded: 247[0]: { ... }\ndeleted: 249[0]: { ... }\nadded: 73882[0]: \"test 123\"\n"
                 ,&local_30);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
      if (local_40[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_30);
        if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = anon_var_dwarf_a22956 + 5;
        }
        else {
          message = (local_38->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&AStack_48,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
                   ,0xed1,message);
        testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_30);
        testing::internal::AssertHelper::~AssertHelper(&AStack_48);
        if ((long *)local_30._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
        }
      }
      if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_38,local_38);
      }
      return;
    }
  }
  __assert_fail("type() == TYPE_GROUP",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/unknown_field_set.h"
                ,0x192,"UnknownFieldSet *google::protobuf::UnknownField::mutable_group()");
}

Assistant:

TEST_F(ComparisonTest, UnknownFieldsAll) {
  unknown1_->AddVarint(243, 122);
  unknown1_->AddFixed64(244, 0x0172356);
  unknown1_->AddFixed64(244, 0x098);
  unknown1_->AddGroup(245)->AddFixed32(248, 1);
  unknown1_->mutable_field(3)->mutable_group()->AddFixed32(248, 2);
  unknown1_->AddGroup(249)->AddFixed64(250, 1);

  unknown2_->AddVarint(243, 121);
  unknown2_->AddLengthDelimited(73882, "test 123");
  unknown2_->AddGroup(245)->AddFixed32(248, 3);
  unknown2_->AddGroup(247);

  EXPECT_EQ(
      "modified: 243[0]: 122 -> 121\n"
      "deleted: 244[0]: 0x0000000000172356\n"
      "deleted: 244[1]: 0x0000000000000098\n"
      "modified: 245[0].248[0]: 0x00000001 -> 0x00000003\n"
      "deleted: 245[0].248[1]: 0x00000002\n"
      "added: 247[0]: { ... }\n"
      "deleted: 249[0]: { ... }\n"
      "added: 73882[0]: \"test 123\"\n",
      RunUn());
}